

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::istringstream&>
          (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          allocator<char> *param_2,basic_istream<char,_std::char_traits<char>_> *param_3,
          basic_csv_decode_options<char> *param_4,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *param_5,
          undefined8 param_6)

{
  char cVar1;
  _Any_data local_50;
  _Manager_type local_40;
  
  *(undefined8 *)this = 0xb34f88;
  *(undefined8 *)(this + 0x408) = 0xb35028;
  stream_source<char>::stream_source((stream_source<char> *)(this + 8),param_3,0x4000);
  this[0x1a0] = (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)0x1;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             param_5);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x1a8),param_4,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             param_2);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(undefined ***)(this + 0x3a8) = &PTR__basic_json_visitor_00b30320;
  *(undefined2 *)(this + 0x3b0) = 3;
  *(undefined4 *)(this + 0x3d8) = 0;
  *(undefined8 *)(this + 0x3b8) = 0;
  *(undefined8 *)(this + 0x3c0) = 0;
  *(undefined8 *)(this + 0x3c4) = 0;
  *(undefined8 *)(this + 0x3cc) = 0;
  *(undefined8 *)(this + 0x3e0) = 0;
  *(undefined8 *)(this + 1000) = 0;
  *(undefined8 *)(this + 0x3f0) = 0;
  *(undefined8 *)(this + 0x3f8) = 0;
  *(undefined8 *)(this + 0x400) = 0;
  this[0x281] = (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)0x1;
  this[0x280] = (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)
                (this[0x1fc] !=
                (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)0x3);
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x40))(this,param_6);
  }
  return;
}

Assistant:

basic_csv_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::function<bool(csv_errc,const ser_context&)> err_handler,
        std::error_code& ec,
        typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(std::forward<Sourceable>(source)),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }